

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O2

void __thiscall RegionChecker::printRegions(RegionChecker *this)

{
  ulong uVar1;
  bool bVar2;
  const_reference cVar3;
  ulong uVar4;
  int i;
  ulong __n;
  
  __n = 0;
  bVar2 = false;
  uVar4 = 0;
  while( true ) {
    uVar1 = (ulong)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
    if (uVar1 <= __n) break;
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->usedBits,__n);
    if (bVar2) {
      if (cVar3) {
        printRange(this,(int)uVar4,(int)__n);
        bVar2 = false;
      }
    }
    else if (!cVar3) {
      bVar2 = true;
      uVar4 = __n & 0xffffffff;
    }
    __n = __n + 1;
  }
  if (!bVar2) {
    return;
  }
  printRange(this,(int)uVar4,(int)uVar1);
  return;
}

Assistant:

void RegionChecker::printRegions() const {
	bool inUnusedRegion = false;
	int startMarker = 0;
	for (int i = 0; i < usedBits.size(); i++) {
		if (!inUnusedRegion && usedBits[i] == false) {
			inUnusedRegion = true;
			startMarker = i;
		}
		else if (inUnusedRegion && usedBits[i] == true) {
			inUnusedRegion = false;
			printRange(startMarker, i);
		}
	}
	if (inUnusedRegion) {
		printRange(startMarker, usedBits.size());
	}
}